

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt)

{
  uint uVar1;
  void *value5;
  xmlChar *pxVar2;
  byte *pbVar3;
  xmlChar *pxVar4;
  byte *pbVar5;
  xmlXPathObjectPtr pxVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  xmlChar xVar14;
  byte *pbVar15;
  bool bVar16;
  double dVar17;
  undefined8 local_48;
  double local_40;
  double local_38;
  
  pbVar3 = ctxt->cur;
  pbVar5 = pbVar3;
  while( true ) {
    pbVar15 = pbVar5 + 1;
    bVar10 = *pbVar5;
    uVar8 = (ulong)bVar10;
    if (0x28 < uVar8) break;
    if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
      if ((0x11000000000U >> (uVar8 & 0x3f) & 1) != 0) goto switchD_001c6472_caseD_27;
      break;
    }
    ctxt->cur = pbVar15;
    pbVar3 = (byte *)(ulong)((int)pbVar3 + 1);
    pbVar5 = pbVar15;
  }
  if ((byte)(bVar10 - 0x30) < 10) goto switchD_001c6472_caseD_27;
  switch(bVar10) {
  case 0x27:
    break;
  case 0x28:
  case 0x29:
  case 0x2b:
  case 0x2c:
  case 0x2d:
switchD_001c6472_caseD_28:
    while (((byte)uVar8 < 0x21 && ((0x100002600U >> (uVar8 & 0x3f) & 1) != 0))) {
      ctxt->cur = pbVar15;
      bVar10 = *pbVar15;
      pbVar3 = (byte *)(ulong)((int)pbVar3 + 1);
      pbVar15 = pbVar15 + 1;
      uVar8 = (ulong)bVar10;
    }
    uVar7 = xmlXPathCurrentChar(ctxt,(int *)&local_48);
    if ((uVar7 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) {
LAB_001c65f9:
      xmlXPathErr(ctxt,7);
      return;
    }
    if (uVar7 < 0x100) {
      if ((0x16 < uVar7 - 0xc0 && 0x19 < (uVar7 & 0xdf) - 0x41) &&
         (((uVar7 < 0xf8 && 0x1e < uVar7 - 0xd8 && ((char)uVar7 != '_')) && ((uVar7 & 0xff) != 0x3a)
          ))) goto LAB_001c65f9;
    }
    else {
      iVar11 = xmlCharInRange(uVar7,&xmlIsBaseCharGroup);
      if ((iVar11 == 0) && ((8 < uVar7 - 0x3021 && 0x51a5 < uVar7 - 0x4e00) && uVar7 != 0x3007))
      goto LAB_001c65f9;
    }
    pbVar15 = pbVar15 + -1;
    while ((0x3e < uVar7 || ((0x4000800100000000U >> ((ulong)uVar7 & 0x3f) & 1) == 0))) {
      if (uVar7 < 0x100) {
        if ((0x16 < uVar7 - 0xc0 && 0x19 < (uVar7 & 0xdf) - 0x41) &&
           ((9 < uVar7 - 0x30 && 0x1e < uVar7 - 0xd8) && uVar7 < 0xf8)) {
LAB_001c677f:
          if ((0x32 < uVar7 - 0x2d) ||
             ((0x4000000002003U >> ((ulong)(uVar7 - 0x2d) & 0x3f) & 1) == 0)) {
            if (uVar7 < 0x100) {
              uVar7 = (uint)(uVar7 == 0xb7);
            }
            else {
              iVar11 = xmlCharInRange(uVar7,&xmlIsCombiningGroup);
              if (iVar11 != 0) goto LAB_001c6798;
              uVar7 = xmlCharInRange(uVar7,&xmlIsExtenderGroup);
            }
            if (uVar7 == 0) break;
          }
        }
      }
      else {
        iVar11 = xmlCharInRange(uVar7,&xmlIsBaseCharGroup);
        if (((iVar11 == 0) && ((8 < uVar7 - 0x3021 && 0x51a5 < uVar7 - 0x4e00) && uVar7 != 0x3007))
           && (iVar11 = xmlCharInRange(uVar7,&xmlIsDigitGroup), iVar11 == 0)) goto LAB_001c677f;
      }
LAB_001c6798:
      ctxt->cur = ctxt->cur + (int)local_48;
      uVar7 = xmlXPathCurrentChar(ctxt,(int *)&local_48);
    }
    pxVar4 = xmlStrndup(pbVar15,*(int *)&ctxt->cur - (int)pbVar3);
    if (pxVar4 == (xmlChar *)0x0) {
      xmlXPathPErrMemory(ctxt);
      ctxt->cur = pbVar15;
      goto LAB_001c65f9;
    }
    ctxt->cur = pbVar15;
    pxVar2 = xmlStrstr(pxVar4,(xmlChar *)"::");
    if (pxVar2 == (xmlChar *)0x0) {
      iVar11 = xmlStrlen(pxVar4);
      lVar13 = (long)iVar11;
      do {
        xVar14 = ctxt->cur[lVar13];
        if (xVar14 != ' ') {
          bVar16 = false;
          if ((xVar14 == '\0') || (bVar16 = false, xVar14 == '/')) goto LAB_001c6897;
          if ((1 < (byte)(xVar14 - 9)) && (xVar14 != '\r')) goto LAB_001c6878;
        }
        lVar13 = lVar13 + 1;
      } while( true );
    }
    (*xmlFree)(pxVar4);
    pbVar5 = ctxt->cur;
    goto LAB_001c6483;
  case 0x2a:
  case 0x2f:
switchD_001c6472_caseD_2a:
    xmlXPathCompExprAdd(ctxt,-1,-1,bVar10 == 0x2f ^ XPATH_OP_NODE,0,0,0,(void *)0x0,(void *)0x0);
    pbVar3 = ctxt->cur;
    while( true ) {
      uVar8 = (ulong)*pbVar3;
      if (0x2f < uVar8) break;
      if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
        if (uVar8 == 0x2f) goto LAB_001c651f;
        break;
      }
      ctxt->cur = pbVar3 + 1;
      pbVar3 = pbVar3 + 1;
    }
    goto LAB_001c6c06;
  case 0x2e:
    if (9 < (byte)(*pbVar15 - 0x30)) goto LAB_001c6483;
    break;
  default:
    if (bVar10 == 0x40) goto switchD_001c6472_caseD_2a;
    if (bVar10 != 0x22) goto switchD_001c6472_caseD_28;
  }
switchD_001c6472_caseD_27:
  pbVar3 = pbVar5 + 1;
  bVar10 = *pbVar5;
  uVar8 = (ulong)bVar10;
  if (uVar8 < 0x29) {
    if ((0x100002600U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_001c68b9;
    if (uVar8 == 0x24) {
      ctxt->cur = pbVar3;
      pxVar4 = xmlXPathParseQName(ctxt,(xmlChar **)&local_48);
      if (pxVar4 != (xmlChar *)0x0) {
        ctxt->comp->last = -1;
        iVar11 = xmlXPathCompExprAdd(ctxt,-1,-1,XPATH_OP_VARIABLE,0,0,0,pxVar4,
                                     (void *)CONCAT44(local_48._4_4_,(int)local_48));
        if (iVar11 == -1) {
          (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
          (*xmlFree)(pxVar4);
        }
        pbVar3 = ctxt->cur;
        while( true ) {
          if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0))
          break;
          ctxt->cur = pbVar3 + 1;
          pbVar3 = pbVar3 + 1;
        }
        if ((ctxt->context != (xmlXPathContextPtr)0x0) &&
           (iVar11 = 0x18, (ctxt->context->flags & 2) != 0)) goto LAB_001c6a97;
        goto LAB_001c6a9c;
      }
      (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
      iVar11 = 4;
      goto LAB_001c6a97;
    }
    if (uVar8 == 0x28) goto LAB_001c68df;
  }
  bVar9 = bVar10 - 0x30;
  if (bVar9 < 10) {
LAB_001c6902:
    if (ctxt->error == 0) {
      if (bVar10 != 0x2e && bVar10 < 0x30) goto LAB_001c6923;
      if (bVar9 < 10) {
        dVar17 = 0.0;
        do {
          ctxt->cur = pbVar3;
          dVar17 = (double)((byte)uVar8 & 0xf) + dVar17 * 10.0;
          bVar10 = *pbVar3;
          uVar8 = (ulong)bVar10;
          pbVar3 = pbVar3 + 1;
        } while ((byte)(bVar10 - 0x30) < 10);
      }
      else {
        dVar17 = 0.0;
      }
      pbVar5 = pbVar3 + -1;
      if (bVar10 == 0x2e) {
        ctxt->cur = pbVar3;
        bVar10 = *pbVar3;
        if (bVar10 < 0x30) {
          if (bVar9 < 10) {
LAB_001c6dca:
            uVar7 = 0;
LAB_001c6dcc:
            local_38 = 0.0;
            if ((byte)(bVar10 - 0x30) < 10) {
              uVar1 = uVar7 + 0x14;
              do {
                pbVar3 = pbVar3 + 1;
                local_38 = local_38 * 10.0 + (double)(int)(bVar10 - 0x30);
                uVar7 = uVar7 + 1;
                ctxt->cur = pbVar3;
                bVar10 = *pbVar3;
                if (9 < (byte)(bVar10 - 0x30)) break;
              } while (uVar7 < uVar1);
            }
            local_40 = dVar17;
            dVar17 = pow(10.0,(double)(int)uVar7);
            dVar17 = local_40 + local_38 / dVar17;
            pbVar5 = ctxt->cur;
            bVar10 = *pbVar5;
            while ((byte)(bVar10 - 0x30) < 10) {
              pbVar5 = pbVar5 + 1;
              ctxt->cur = pbVar5;
              bVar10 = *pbVar5;
            }
            goto LAB_001c6e69;
          }
        }
        else if ((bVar9 < 10) || (bVar10 < 0x3a)) {
          if (bVar10 != 0x30) goto LAB_001c6dca;
          uVar7 = 0;
          do {
            pbVar3 = pbVar3 + 1;
            uVar7 = uVar7 + 1;
            ctxt->cur = pbVar3;
            bVar10 = *pbVar3;
          } while (bVar10 == 0x30);
          goto LAB_001c6dcc;
        }
LAB_001c6923:
        iVar11 = 1;
        goto LAB_001c6a97;
      }
LAB_001c6e69:
      if ((bVar10 | 0x20) == 0x65) {
        pbVar3 = pbVar5 + 1;
        ctxt->cur = pbVar3;
        bVar10 = pbVar5[1];
        if ((bVar10 == 0x2d) || (bVar9 = bVar10, bVar10 == 0x2b)) {
          pbVar3 = pbVar5 + 2;
          ctxt->cur = pbVar3;
          bVar9 = pbVar5[2];
        }
        iVar11 = 0;
        if ((byte)(bVar9 - 0x30) < 10) {
          iVar11 = 0;
          do {
            pbVar3 = pbVar3 + 1;
            iVar12 = (bVar9 - 0x30) + iVar11 * 10;
            if (999999 < iVar11) {
              iVar12 = iVar11;
            }
            iVar11 = iVar12;
            ctxt->cur = pbVar3;
            bVar9 = *pbVar3;
          } while ((byte)(bVar9 - 0x30) < 10);
        }
        iVar12 = -iVar11;
        if (bVar10 != 0x2d) {
          iVar12 = iVar11;
        }
        local_40 = dVar17;
        dVar17 = pow(10.0,(double)iVar12);
        dVar17 = local_40 * dVar17;
      }
      pxVar6 = xmlXPathCacheNewFloat(ctxt,dVar17);
      if (pxVar6 == (xmlXPathObjectPtr)0x0) {
        ctxt->error = 0xf;
      }
      else {
        iVar11 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,3,0,0,pxVar6,
                                     (void *)0x0);
        if (iVar11 == -1) {
          xmlXPathReleaseObject(ctxt->context,pxVar6);
        }
      }
    }
  }
  else if ((bVar10 == 0x22) || (bVar10 == 0x27)) {
    pxVar4 = xmlXPathParseLiteral(ctxt);
    if (pxVar4 != (xmlChar *)0x0) {
      pxVar6 = xmlXPathCacheNewString(ctxt,pxVar4);
      if (pxVar6 == (xmlXPathObjectPtr)0x0) {
        ctxt->error = 0xf;
      }
      else {
        iVar11 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,4,0,0,pxVar6,
                                     (void *)0x0);
        if (iVar11 == -1) {
          xmlXPathReleaseObject(ctxt->context,pxVar6);
        }
      }
      (*xmlFree)(pxVar4);
    }
  }
  else {
    if ((bVar10 == 0x2e) && ((byte)(*pbVar3 - 0x30) < 10)) goto LAB_001c6902;
    pxVar4 = xmlXPathParseQName(ctxt,(xmlChar **)&local_48);
    if (pxVar4 == (xmlChar *)0x0) {
      (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
    }
    else {
      pbVar3 = ctxt->cur;
      while( true ) {
        pbVar5 = pbVar3 + 1;
        uVar8 = (ulong)*pbVar3;
        if (0x28 < uVar8) break;
        if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
          if (uVar8 == 0x28) goto LAB_001c6c82;
          break;
        }
        ctxt->cur = pbVar5;
        pbVar3 = pbVar5;
      }
      (*xmlFree)(pxVar4);
      (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
    }
LAB_001c6d5d:
    iVar11 = 7;
LAB_001c6a97:
    xmlXPathErr(ctxt,iVar11);
  }
  goto LAB_001c6a9c;
LAB_001c6878:
  if (xVar14 == '(') {
    iVar11 = xmlXPathIsNodeType(pxVar4);
    bVar16 = iVar11 == 0;
    xVar14 = ctxt->cur[lVar13];
  }
  else {
    bVar16 = false;
  }
LAB_001c6897:
  (*xmlFree)(pxVar4);
  pbVar5 = ctxt->cur;
  if ((xVar14 == '\0') || (!bVar16)) {
LAB_001c6483:
    bVar10 = *pbVar5;
    goto switchD_001c6472_caseD_2a;
  }
  goto switchD_001c6472_caseD_27;
LAB_001c651f:
  do {
    pbVar3 = ctxt->cur;
    if (*pbVar3 != 0x2f) break;
    if (pbVar3[1] == 0x2f) {
      pbVar3 = pbVar3 + 2;
      while( true ) {
        ctxt->cur = pbVar3;
        if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
        pbVar3 = pbVar3 + 1;
      }
      xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0);
LAB_001c65ba:
      xmlXPathCompRelativeLocationPath(ctxt);
    }
    else {
      do {
        pbVar3 = pbVar3 + 1;
        ctxt->cur = pbVar3;
        bVar10 = *pbVar3;
        uVar8 = (ulong)bVar10;
        if (0x20 < uVar8) goto LAB_001c6566;
      } while ((0x100002600U >> (uVar8 & 0x3f) & 1) != 0);
      if (uVar8 != 0) {
LAB_001c6566:
        if ((((char)bVar10 < '\0') || ((byte)((bVar10 | 0x20) + 0x9f) < 0x1a)) ||
           ((bVar10 - 0x2a < 0x36 &&
            ((0x20000000400011U >> ((ulong)(bVar10 - 0x2a) & 0x3f) & 1) != 0)))) goto LAB_001c65ba;
      }
    }
  } while (ctxt->error == 0);
  goto LAB_001c6c0e;
LAB_001c68b9:
  ctxt->cur = pbVar3;
  pbVar5 = pbVar3;
  goto switchD_001c6472_caseD_27;
LAB_001c68df:
  while( true ) {
    ctxt->cur = pbVar3;
    if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
    pbVar3 = pbVar3 + 1;
  }
  xmlXPathCompileExpr(ctxt,1);
  if (ctxt->error == 0) {
    pbVar3 = ctxt->cur;
    if (*pbVar3 == 0x29) {
      do {
        pbVar3 = pbVar3 + 1;
        ctxt->cur = pbVar3;
        if (0x20 < (ulong)*pbVar3) break;
      } while ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0);
      goto LAB_001c6a9c;
    }
    xmlXPathErr(ctxt,7);
  }
  goto LAB_001c6b44;
LAB_001c6c82:
  while( true ) {
    ctxt->cur = pbVar5;
    if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) break;
    pbVar5 = pbVar5 + 1;
  }
  value5 = (void *)CONCAT44(local_48._4_4_,(int)local_48);
  uVar7 = 1;
  if ((value5 == (void *)0x0) && (*pxVar4 == 'c')) {
    iVar11 = xmlStrEqual(pxVar4,(xmlChar *)"count");
    uVar7 = (uint)(iVar11 == 0);
    pbVar5 = ctxt->cur;
  }
  ctxt->comp->last = -1;
  iVar11 = -1;
  iVar12 = 0;
  if ((*pbVar5 == 0) || (iVar12 = 0, *pbVar5 == 0x29)) {
LAB_001c7008:
    iVar11 = xmlXPathCompExprAdd(ctxt,iVar11,-1,XPATH_OP_FUNCTION,iVar12,0,0,pxVar4,value5);
    if (iVar11 == -1) {
      (*xmlFree)(value5);
      (*xmlFree)(pxVar4);
    }
    pbVar3 = ctxt->cur;
    if (*pbVar3 != 0) goto LAB_001c706f;
    while (((ulong)*pbVar3 < 0x21 && ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
LAB_001c706f:
      pbVar3 = pbVar3 + 1;
      ctxt->cur = pbVar3;
    }
  }
  else {
    xmlXPathCompileExpr(ctxt,uVar7);
    if (ctxt->error == 0) {
      iVar12 = 0;
      iVar11 = -1;
      do {
        xmlXPathCompExprAdd(ctxt,iVar11,ctxt->comp->last,XPATH_OP_ARG,0,0,0,(void *)0x0,(void *)0x0)
        ;
        iVar12 = iVar12 + 1;
        pbVar3 = ctxt->cur;
        if (*pbVar3 != 0x2c) {
          if (*pbVar3 != 0x29) {
            (*xmlFree)(pxVar4);
            (*xmlFree)(value5);
            goto LAB_001c6d5d;
          }
LAB_001c7001:
          iVar11 = ctxt->comp->last;
          goto LAB_001c7008;
        }
        do {
          pbVar3 = pbVar3 + 1;
          ctxt->cur = pbVar3;
          uVar8 = (ulong)*pbVar3;
          if (0x20 < uVar8) goto LAB_001c6fcd;
        } while ((0x100002600U >> (uVar8 & 0x3f) & 1) != 0);
        if (uVar8 == 0) goto LAB_001c7001;
LAB_001c6fcd:
        local_40 = (double)CONCAT44(local_40._4_4_,ctxt->comp->last);
        ctxt->comp->last = -1;
        xmlXPathCompileExpr(ctxt,uVar7);
        iVar11 = local_40._0_4_;
      } while (ctxt->error == 0);
    }
    (*xmlFree)(pxVar4);
    (*xmlFree)(value5);
  }
LAB_001c6a9c:
  pbVar3 = ctxt->cur;
  while( true ) {
    if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar3 + 1;
    pbVar3 = pbVar3 + 1;
  }
LAB_001c6b44:
  if (ctxt->error == 0) {
    pbVar3 = ctxt->cur;
    while( true ) {
      bVar10 = *pbVar3;
      if ((0x20 < (ulong)bVar10) || ((0x100002600U >> ((ulong)bVar10 & 0x3f) & 1) == 0)) break;
      pbVar3 = pbVar3 + 1;
      ctxt->cur = pbVar3;
    }
    if (bVar10 == 0x5b) {
      do {
        xmlXPathCompPredicate(ctxt,1);
        pbVar3 = ctxt->cur;
        while( true ) {
          bVar10 = *pbVar3;
          if ((0x20 < (ulong)bVar10) || ((0x100002600U >> ((ulong)bVar10 & 0x3f) & 1) == 0)) break;
          pbVar3 = pbVar3 + 1;
          ctxt->cur = pbVar3;
        }
      } while (bVar10 == 0x5b);
      if (ctxt->error != 0) {
        return;
      }
    }
    if (bVar10 == 0x2f) {
      if (pbVar3[1] == 0x2f) {
        pbVar3 = pbVar3 + 2;
        while( true ) {
          ctxt->cur = pbVar3;
          if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0))
          break;
          pbVar3 = pbVar3 + 1;
        }
        xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0)
        ;
      }
LAB_001c6c06:
      xmlXPathCompRelativeLocationPath(ctxt);
    }
LAB_001c6c0e:
    pbVar3 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar3 + 1;
      pbVar3 = pbVar3 + 1;
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt) {
    int lc = 1;           /* Should we branch to LocationPath ?         */
    xmlChar *name = NULL; /* we may have to preparse a name to find out */

    SKIP_BLANKS;
    if ((CUR == '$') || (CUR == '(') ||
	(IS_ASCII_DIGIT(CUR)) ||
        (CUR == '\'') || (CUR == '"') ||
	(CUR == '.' && IS_ASCII_DIGIT(NXT(1)))) {
	lc = 0;
    } else if (CUR == '*') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '/') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '@') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else if (CUR == '.') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else {
	/*
	 * Problem is finding if we have a name here whether it's:
	 *   - a nodetype
	 *   - a function call in which case it's followed by '('
	 *   - an axis in which case it's followed by ':'
	 *   - a element name
	 * We do an a priori analysis here rather than having to
	 * maintain parsed token content through the recursive function
	 * calls. This looks uglier but makes the code easier to
	 * read/write/debug.
	 */
	SKIP_BLANKS;
	name = xmlXPathScanName(ctxt);
	if ((name != NULL) && (xmlStrstr(name, (xmlChar *) "::") != NULL)) {
	    lc = 1;
	    xmlFree(name);
	} else if (name != NULL) {
	    int len =xmlStrlen(name);


	    while (NXT(len) != 0) {
		if (NXT(len) == '/') {
		    /* element name */
		    lc = 1;
		    break;
		} else if (IS_BLANK_CH(NXT(len))) {
		    /* ignore blanks */
		    ;
		} else if (NXT(len) == ':') {
		    lc = 1;
		    break;
		} else if ((NXT(len) == '(')) {
		    /* Node Type or Function */
		    if (xmlXPathIsNodeType(name)) {
			lc = 1;
		    } else {
			lc = 0;
		    }
                    break;
		} else if ((NXT(len) == '[')) {
		    /* element name */
		    lc = 1;
		    break;
		} else if ((NXT(len) == '<') || (NXT(len) == '>') ||
			   (NXT(len) == '=')) {
		    lc = 1;
		    break;
		} else {
		    lc = 1;
		    break;
		}
		len++;
	    }
	    if (NXT(len) == 0) {
		/* element name */
		lc = 1;
	    }
	    xmlFree(name);
	} else {
	    /* make sure all cases are covered explicitly */
	    XP_ERROR(XPATH_EXPR_ERROR);
	}
    }

    if (lc) {
	if (CUR == '/') {
	    PUSH_LEAVE_EXPR(XPATH_OP_ROOT, 0, 0);
	} else {
	    PUSH_LEAVE_EXPR(XPATH_OP_NODE, 0, 0);
	}
	xmlXPathCompLocationPath(ctxt);
    } else {
	xmlXPathCompFilterExpr(ctxt);
	CHECK_ERROR;
	if ((CUR == '/') && (NXT(1) == '/')) {
	    SKIP(2);
	    SKIP_BLANKS;

	    PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_DESCENDANT_OR_SELF,
		    NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);

	    xmlXPathCompRelativeLocationPath(ctxt);
	} else if (CUR == '/') {
	    xmlXPathCompRelativeLocationPath(ctxt);
	}
    }
    SKIP_BLANKS;
}